

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O0

bool __thiscall
cmVariableWatch::VariableAccessed
          (cmVariableWatch *this,string *variable,int access_type,char *newValue,cmMakefile *mf)

{
  WatchMethod p_Var1;
  bool bVar2;
  pointer ppVar3;
  element_type *peVar4;
  undefined1 local_b8 [8];
  shared_ptr<cmVariableWatch::Pair> it;
  weak_ptr<cmVariableWatch::Pair> *weak_it;
  iterator __end2;
  iterator __begin2;
  vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
  *__range2;
  allocator<std::weak_ptr<cmVariableWatch::Pair>_> local_71;
  __normal_iterator<const_std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
  local_70;
  __normal_iterator<const_std::shared_ptr<cmVariableWatch::Pair>_*,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>
  local_68;
  undefined1 local_60 [8];
  vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
  vp;
  _Self local_40;
  const_iterator mit;
  cmMakefile *mf_local;
  char *newValue_local;
  int access_type_local;
  string *variable_local;
  cmVariableWatch *this_local;
  
  mit._M_node = (_Base_ptr)mf;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
       ::find(&this->WatchMap,variable);
  vp.
  super__Vector_base<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
                ::end(&this->WatchMap);
  bVar2 = std::operator!=(&local_40,
                          (_Self *)&vp.
                                    super__Vector_base<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>
             ::operator->(&local_40);
    local_68._M_current =
         (shared_ptr<cmVariableWatch::Pair> *)
         std::
         vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
         ::begin(&ppVar3->second);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>
             ::operator->(&local_40);
    local_70._M_current =
         (shared_ptr<cmVariableWatch::Pair> *)
         std::
         vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
         ::end(&ppVar3->second);
    std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>::allocator(&local_71);
    std::
    vector<std::weak_ptr<cmVariableWatch::Pair>,std::allocator<std::weak_ptr<cmVariableWatch::Pair>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<cmVariableWatch::Pair>const*,std::vector<std::shared_ptr<cmVariableWatch::Pair>,std::allocator<std::shared_ptr<cmVariableWatch::Pair>>>>,void>
              ((vector<std::weak_ptr<cmVariableWatch::Pair>,std::allocator<std::weak_ptr<cmVariableWatch::Pair>>>
                *)local_60,local_68,local_70,&local_71);
    std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>::~allocator(&local_71);
    __end2 = std::
             vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
             ::begin((vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
                      *)local_60);
    weak_it = (weak_ptr<cmVariableWatch::Pair> *)
              std::
              vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
              ::end((vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
                     *)local_60);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::weak_ptr<cmVariableWatch::Pair>_*,_std::vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>_>
                                       *)&weak_it), bVar2) {
      it.super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<std::weak_ptr<cmVariableWatch::Pair>_*,_std::vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>_>
           ::operator*(&__end2);
      std::weak_ptr<cmVariableWatch::Pair>::lock((weak_ptr<cmVariableWatch::Pair> *)local_b8);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b8);
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b8);
        p_Var1 = peVar4->Method;
        peVar4 = std::
                 __shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b8);
        (*p_Var1)(variable,access_type,peVar4->ClientData,newValue,(cmMakefile *)mit._M_node);
      }
      std::shared_ptr<cmVariableWatch::Pair>::~shared_ptr
                ((shared_ptr<cmVariableWatch::Pair> *)local_b8);
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<cmVariableWatch::Pair>_*,_std::vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = true;
    std::
    vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
    ::~vector((vector<std::weak_ptr<cmVariableWatch::Pair>,_std::allocator<std::weak_ptr<cmVariableWatch::Pair>_>_>
               *)local_60);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmVariableWatch::VariableAccessed(const std::string& variable,
                                       int access_type, const char* newValue,
                                       const cmMakefile* mf) const
{
  cmVariableWatch::StringToVectorOfPairs::const_iterator mit =
    this->WatchMap.find(variable);
  if (mit != this->WatchMap.end()) {
    // The strategy here is to copy the list of callbacks, and ignore
    // new callbacks that existing ones may add.
    std::vector<std::weak_ptr<Pair>> vp(mit->second.begin(),
                                        mit->second.end());
    for (auto& weak_it : vp) {
      // In the case where a callback was removed, the weak_ptr will not be
      // lockable, and so this ensures we don't attempt to call into freed
      // memory
      if (auto it = weak_it.lock()) {
        it->Method(variable, access_type, it->ClientData, newValue, mf);
      }
    }
    return true;
  }
  return false;
}